

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void Qentem::TestOutPut::Print<char_const*,char[5],char_const*,char[3],char_const*,char>
               (char **values,char (*values_1) [5],char **values_2,char (*values_3) [3],
               char **values_4,char *values_5)

{
  long *plVar1;
  wchar_t wVar2;
  wostream *pwVar3;
  wchar_t *pwVar4;
  wchar_t local_30;
  wchar_t local_2c;
  
  if (GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar3 = std::operator<<((wostream *)&std::wcout,*values);
    pwVar3 = std::operator<<(pwVar3,*values_1);
    pwVar3 = std::operator<<(pwVar3,*values_2);
    pwVar3 = std::operator<<(pwVar3,*values_3);
    pwVar3 = std::operator<<(pwVar3,*values_4);
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) goto LAB_00113c03;
    wVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,(int)*values_5);
    pwVar4 = &local_30;
  }
  else {
    pwVar3 = std::operator<<((wostream *)(GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10),
                             *values);
    pwVar3 = std::operator<<(pwVar3,*values_1);
    pwVar3 = std::operator<<(pwVar3,*values_2);
    pwVar3 = std::operator<<(pwVar3,*values_3);
    pwVar3 = std::operator<<(pwVar3,*values_4);
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) {
LAB_00113c03:
      std::__throw_bad_cast();
    }
    wVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,(int)*values_5);
    pwVar4 = &local_2c;
  }
  *pwVar4 = wVar2;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,pwVar4,1);
  return;
}

Assistant:

inline static void Print(const Values_T &...values) {
        if (GetStreamCache() == nullptr) {
#if __cplusplus > 201402L
            (std::wcout << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {(std::wcout << values, 0)...};
            (void)dummy;
#endif

        } else {
#if __cplusplus > 201402L
            ((*GetStreamCache()) << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {((*GetStreamCache()) << values, 0)...};
            (void)dummy;
#endif
        }
    }